

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_lib.cpp
# Opt level: O2

int tcpSharedListen(lua_State *L)

{
  bool bVar1;
  char *pcVar2;
  lua_Integer lVar3;
  EmmyFacade *this;
  int iVar4;
  allocator local_71;
  string err;
  string local_50;
  
  (*luaL_checklstring)(L,1,(size_t *)0x0);
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  pcVar2 = (*lua_tolstring)(L,1,(size_t *)0x0);
  (*luaL_checknumber)(L,2);
  lVar3 = lua_tointeger(L,2);
  this = EmmyFacade::Get();
  std::__cxx11::string::string((string *)&local_50,pcVar2,&local_71);
  bVar1 = EmmyFacade::TcpSharedListen(this,L,&local_50,(int)lVar3,&err);
  std::__cxx11::string::~string((string *)&local_50);
  (*lua_pushboolean)(L,SUB14(bVar1,0));
  iVar4 = 1;
  if (!bVar1) {
    (*lua_pushstring)(L,err._M_dataplus._M_p);
    iVar4 = 2;
  }
  std::__cxx11::string::~string((string *)&err);
  return iVar4;
}

Assistant:

int tcpSharedListen(lua_State* L)
{
	luaL_checkstring(L, 1);
	std::string err;
	const auto host = lua_tostring(L, 1);
	luaL_checknumber(L, 2);
	const auto port = lua_tointeger(L, 2);
	const auto suc = EmmyFacade::Get().TcpSharedListen(L, host, static_cast<int>(port), err);
	lua_pushboolean(L, suc);
	if (suc) return 1;
	lua_pushstring(L, err.c_str());
	return 2;
}